

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

int __thiscall rcg::Device::getAvailableModuleEvents(Device *this)

{
  GC_ERROR GVar1;
  int iVar2;
  size_t ret;
  size_t size;
  INFO_DATATYPE type;
  
  std::mutex::lock(&this->mtx);
  ret = 0;
  size = 8;
  iVar2 = 0;
  if (this->event != (EVENT_HANDLE)0x0) {
    GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->EventGetInfo)(this->event,1,&type,&ret,&size);
    iVar2 = 0;
    if (GVar1 == 0) {
      iVar2 = (int)ret;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar2;
}

Assistant:

int Device::getAvailableModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);
  size_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (event != 0)
  {
    if (gentl->EventGetInfo(event, GenTL::EVENT_NUM_IN_QUEUE, &type, &ret, &size) != GenTL::GC_ERR_SUCCESS)
    {
      ret=0;
    }
  }

  return static_cast<int>(ret);
}